

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O1

bool MakeBanner(path *specfile_path,path *outfile_path)

{
  char cVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  SpecFileData specfile_data;
  ofstream ostream;
  path local_da0;
  undefined1 local_d78 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d70;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d50;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_d30;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_d10;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_cf0;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_cd0;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_cb0;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_c90;
  long local_c70;
  filebuf local_c68 [240];
  ios_base local_b78 [264];
  IconBitmap local_a70;
  undefined1 local_870 [32];
  u8 local_850 [8];
  wstring local_848 [32];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_828;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_808;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_7e8;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_7c8;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_7a8;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_788 [9];
  pointer local_650;
  size_type sStack_648;
  size_type local_640;
  uchar auStack_638 [8];
  undefined2 auStack_630 [128];
  undefined2 auStack_530 [128];
  undefined2 auStack_430 [128];
  undefined2 auStack_330 [128];
  undefined2 auStack_230 [128];
  undefined2 auStack_130 [128];
  
  std::ofstream::ofstream(&local_c70,(outfile_path->_M_pathname)._M_dataplus._M_p,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    bVar4 = false;
    printf("error: could not open %s for writing\n",(outfile_path->_M_pathname)._M_dataplus._M_p);
  }
  else {
    local_d70._M_dataplus._M_p = (pointer)(local_d78 + 0x18);
    local_d78._0_2_ = 0;
    local_d70._M_string_length = 0;
    local_d70.field_2._M_local_buf[0] = L'\0';
    local_d50._M_dataplus._M_p = (pointer)(local_d78 + 0x38);
    local_d50._M_string_length = 0;
    local_d50.field_2._M_local_buf[0] = L'\0';
    local_d30._M_dataplus._M_p = (pointer)(local_d78 + 0x58);
    local_d30._M_string_length = 0;
    local_d30.field_2._M_local_buf[0] = L'\0';
    local_d10._M_dataplus._M_p = (pointer)(local_d78 + 0x78);
    local_d10._M_string_length = 0;
    local_d10.field_2._M_local_buf[0] = L'\0';
    local_cf0._M_dataplus._M_p = (pointer)(local_d78 + 0x98);
    local_cf0._M_string_length = 0;
    local_cf0.field_2._M_local_buf[0] = L'\0';
    local_cd0._M_dataplus._M_p = (pointer)(local_d78 + 0xb8);
    local_cd0._M_string_length = 0;
    local_cd0.field_2._M_local_buf[0] = L'\0';
    local_cb0._M_dataplus._M_p = (pointer)(local_d78 + 0xd8);
    local_cb0._M_string_length = 0;
    local_cb0.field_2._M_local_buf[0] = L'\0';
    local_c90._M_dataplus._M_p = (pointer)(local_d78 + 0xf8);
    local_c90._M_string_length = 0;
    local_c90.field_2._M_local_buf[0] = L'\0';
    ParseSpecFile((SpecFileData *)local_870,specfile_path);
    local_d78._0_2_ = local_870._0_2_;
    std::__cxx11::wstring::operator=((wstring *)(local_d78 + 8),(wstring *)(local_870 + 8));
    std::__cxx11::wstring::operator=((wstring *)(local_d78 + 0x28),local_848);
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    operator=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
              (local_d78 + 0x48),&local_828);
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    operator=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
              (local_d78 + 0x68),&local_808);
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    operator=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
              (local_d78 + 0x88),&local_7e8);
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    operator=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
              (local_d78 + 0xa8),&local_7c8);
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    operator=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
              (local_d78 + 200),&local_7a8);
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    operator=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
              (local_d78 + 0xe8),local_788);
    SpecFileData::~SpecFileData((SpecFileData *)local_870);
    memset(local_870,0,0x840);
    local_870._0_2_ = local_d78._0_2_;
    std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
              (&local_da0,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               (local_d78 + 8),auto_format);
    GetIconBitmap(&local_a70,&local_da0);
    memcpy(local_850,&local_a70,0x200);
    std::filesystem::__cxx11::path::~path(&local_da0);
    std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
              ((path *)&local_a70,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               (local_d78 + 0x28),auto_format);
    GetIconPalette((IconPalette *)&local_da0,(path *)&local_a70);
    local_640 = local_da0._M_pathname.field_2._M_allocated_capacity;
    auStack_638[0] = local_da0._M_pathname.field_2._M_local_buf[8];
    auStack_638[1] = local_da0._M_pathname.field_2._M_local_buf[9];
    auStack_638[2] = local_da0._M_pathname.field_2._M_local_buf[10];
    auStack_638[3] = local_da0._M_pathname.field_2._M_local_buf[0xb];
    auStack_638[4] = local_da0._M_pathname.field_2._M_local_buf[0xc];
    auStack_638[5] = local_da0._M_pathname.field_2._M_local_buf[0xd];
    auStack_638[6] = local_da0._M_pathname.field_2._M_local_buf[0xe];
    auStack_638[7] = local_da0._M_pathname.field_2._M_local_buf[0xf];
    local_650 = local_da0._M_pathname._M_dataplus._M_p;
    sStack_648 = local_da0._M_pathname._M_string_length;
    std::filesystem::__cxx11::path::~path((path *)&local_a70);
    if (0 < (long)local_d30._M_string_length) {
      lVar2 = local_d30._M_string_length + 1;
      lVar3 = 0;
      do {
        *(undefined2 *)((long)auStack_630 + lVar3) =
             *(undefined2 *)((long)local_d30._M_dataplus._M_p + lVar3);
        lVar2 = lVar2 + -1;
        lVar3 = lVar3 + 2;
      } while (1 < lVar2);
    }
    if (0 < (long)local_d10._M_string_length) {
      lVar2 = local_d10._M_string_length + 1;
      lVar3 = 0;
      do {
        *(undefined2 *)((long)auStack_530 + lVar3) =
             *(undefined2 *)((long)local_d10._M_dataplus._M_p + lVar3);
        lVar2 = lVar2 + -1;
        lVar3 = lVar3 + 2;
      } while (1 < lVar2);
    }
    if (0 < (long)local_cf0._M_string_length) {
      lVar2 = local_cf0._M_string_length + 1;
      lVar3 = 0;
      do {
        *(undefined2 *)((long)auStack_430 + lVar3) =
             *(undefined2 *)((long)local_cf0._M_dataplus._M_p + lVar3);
        lVar2 = lVar2 + -1;
        lVar3 = lVar3 + 2;
      } while (1 < lVar2);
    }
    if (0 < (long)local_cd0._M_string_length) {
      lVar2 = local_cd0._M_string_length + 1;
      lVar3 = 0;
      do {
        *(undefined2 *)((long)auStack_330 + lVar3) =
             *(undefined2 *)((long)local_cd0._M_dataplus._M_p + lVar3);
        lVar2 = lVar2 + -1;
        lVar3 = lVar3 + 2;
      } while (1 < lVar2);
    }
    if (0 < (long)local_cb0._M_string_length) {
      lVar2 = local_cb0._M_string_length + 1;
      lVar3 = 0;
      do {
        *(undefined2 *)((long)auStack_230 + lVar3) =
             *(undefined2 *)((long)local_cb0._M_dataplus._M_p + lVar3);
        lVar2 = lVar2 + -1;
        lVar3 = lVar3 + 2;
      } while (1 < lVar2);
    }
    if (0 < (long)local_c90._M_string_length) {
      lVar2 = local_c90._M_string_length + 1;
      lVar3 = 0;
      do {
        *(undefined2 *)((long)auStack_130 + lVar3) =
             *(undefined2 *)((long)local_c90._M_dataplus._M_p + lVar3);
        lVar2 = lVar2 + -1;
        lVar3 = lVar3 + 2;
      } while (1 < lVar2);
    }
    local_870._2_2_ = CalculateCRC16FromBannerData(local_850);
    OutputBanner((ofstream *)&local_c70,(Banner *)local_870);
    bVar4 = true;
    SpecFileData::~SpecFileData((SpecFileData *)local_d78);
  }
  local_c70 = _VTT;
  *(undefined8 *)(local_c68 + *(long *)(_VTT + -0x18) + -8) = __M_split_cmpts;
  std::filebuf::~filebuf(local_c68);
  std::ios_base::~ios_base(local_b78);
  return bVar4;
}

Assistant:

bool MakeBanner(const std::filesystem::path& specfile_path, const std::filesystem::path& outfile_path) {
    std::ofstream ostream(outfile_path, std::ios::binary);
    if (!ostream.is_open()) {
#ifdef _MSC_VER
        printf("error: could not open %ls for writing\n", outfile_path.c_str());
#else
        printf("error: could not open %s for writing\n", outfile_path.c_str());
#endif
        return false;
    }

    SpecFileData specfile_data = {};
    try {
        specfile_data = ParseSpecFile(specfile_path);
    } catch (std::runtime_error& e) {
        printf("error: %s\n", e.what());
        return false;
    }

    Banner banner = {};

    banner.version = specfile_data.version;
    banner.bitmap = GetIconBitmap(specfile_data.icon_bitmap_filename);
    banner.palette = GetIconPalette(specfile_data.icon_palette_filename);

    std::copy(specfile_data.japanese_title.begin(), specfile_data.japanese_title.end(), banner.japanese_title.data());
    std::copy(specfile_data.english_title.begin(), specfile_data.english_title.end(), banner.english_title.data());
    std::copy(specfile_data.french_title.begin(), specfile_data.french_title.end(), banner.french_title.data());
    std::copy(specfile_data.german_title.begin(), specfile_data.german_title.end(), banner.german_title.data());
    std::copy(specfile_data.italian_title.begin(), specfile_data.italian_title.end(), banner.italian_title.data());
    std::copy(specfile_data.spanish_title.begin(), specfile_data.spanish_title.end(), banner.spanish_title.data());

    // checksum the banner data, starting from the icon bitmap and ending at the end of the file.
    banner.crc = CalculateCRC16FromBannerData(banner.bitmap.data());

    // check against diamond's icon crc
    // if (banner.crc != 0x048B) {
    //     printf("CRC did not match (expected 0x048B, got 0x%04X)\n", banner.crc);
    // } else {
    //     printf("CRC matched\n");
    // }

    OutputBanner(ostream, banner);
    return true;
}